

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_bool32 ma_dr_flac__init_private__ogg
                    (ma_dr_flac_init_info *pInit,ma_dr_flac_read_proc onRead,
                    ma_dr_flac_seek_proc onSeek,ma_dr_flac_meta_proc onMeta,void *pUserData,
                    void *pUserDataMD,ma_bool32 relaxed)

{
  ma_uint64 mVar1;
  ma_result mVar2;
  ma_bool32 mVar3;
  size_t sVar4;
  ulong uVar5;
  int iVar6;
  bool bVar7;
  char cVar8;
  ma_uint8 packetType;
  ma_uint32 bytesRead;
  ma_uint8 mappingVersion [2];
  ma_uint32 crc32;
  ma_dr_flac_streaminfo streaminfo;
  ma_uint32 blockHeader;
  ma_dr_flac_ogg_page_header header;
  char local_261;
  int local_260;
  ma_uint32 local_25c;
  char local_256 [2];
  uint local_254;
  uint local_250;
  ma_uint32 local_24c;
  void *local_248;
  ma_dr_flac_ogg_page_header *local_240;
  ma_dr_flac_meta_proc local_238;
  anon_struct_4_1_6f0ff714_for_padding local_230;
  ma_uint32 mStack_22c;
  ma_uint32 mStack_228;
  ma_uint32 mStack_224;
  undefined4 local_220;
  undefined4 uStack_21c;
  undefined4 uStack_218;
  undefined4 uStack_214;
  ma_uint32 local_210;
  ma_uint32 mStack_20c;
  ma_uint32 mStack_208;
  ma_uint32 mStack_204;
  ma_dr_flac_metadata local_200;
  ma_dr_flac_ogg_page_header local_150;
  
  local_24c = 0x5fb0a94f;
  local_25c = 0;
  pInit->container = ma_dr_flac_container_ogg;
  pInit->oggFirstBytePos = 0;
  mVar2 = ma_dr_flac_ogg__read_page_header_after_capture_pattern
                    (onRead,pUserData,&local_150,&local_25c,&local_24c);
  mVar3 = 0;
  if (mVar2 == MA_SUCCESS) {
    pInit->runningFilePos = pInit->runningFilePos + (ulong)local_25c;
    local_240 = &pInit->oggBosHeader;
    local_254 = (uint)local_240;
    local_250 = local_254;
    local_248 = pUserDataMD;
    local_238 = onMeta;
    do {
      if ((local_150.headerType & 2) == 0) {
LAB_001687ab:
        cVar8 = '\x01';
      }
      else {
        if ((ulong)local_150.segmentCount == 0) {
          iVar6 = 0;
        }
        else {
          uVar5 = 0;
          iVar6 = 0;
          do {
            iVar6 = iVar6 + (uint)local_150.segmentTable[uVar5];
            uVar5 = uVar5 + 1;
          } while (local_150.segmentCount != uVar5);
        }
        if (iVar6 == 0x33) {
          sVar4 = (*onRead)(pUserData,&local_261,1);
          cVar8 = '\x01';
          if (sVar4 == 1) {
            if (local_261 == '\x7f') {
              sVar4 = (*onRead)(pUserData,&local_260,4);
              cVar8 = '\x01';
              if (sVar4 == 4) {
                if (local_260 == 0x43414c46) {
                  sVar4 = (*onRead)(pUserData,local_256,2);
                  cVar8 = '\x01';
                  if ((((sVar4 == 2) && (local_256[0] == '\x01')) &&
                      (mVar3 = (*onSeek)(pUserData,2,ma_dr_flac_seek_origin_current), mVar3 != 0))
                     && ((sVar4 = (*onRead)(pUserData,&local_260,4), sVar4 == 4 &&
                         (local_260 == 0x43614c66)))) {
                    sVar4 = (*onRead)(pUserData,&local_200,4);
                    bVar7 = true;
                    if (sVar4 == 4) {
                      local_254 = (local_200.type << 0x18) >> 0x1f;
                      local_250 = (local_200.type << 0x18 & 0x7f000000) >> 0x18;
                      bVar7 = (local_200.type >> 0x18 | (local_200.type & 0xff0000) >> 8 |
                              (local_200.type & 0xff00) << 8) != 0x22;
                    }
                    cVar8 = '\x01';
                    if (((sVar4 == 4) && ((char)local_250 == '\0')) &&
                       ((!bVar7 &&
                        (mVar3 = ma_dr_flac__read_streaminfo
                                           (onRead,pUserData,(ma_dr_flac_streaminfo *)&local_230),
                        mVar3 != 0)))) {
                      pInit->hasStreamInfoBlock = 1;
                      pInit->sampleRate = mStack_224;
                      pInit->channels = (ma_uint8)local_220;
                      pInit->bitsPerSample = local_220._1_1_;
                      pInit->totalPCMFrameCount = CONCAT44(uStack_214,uStack_218);
                      pInit->maxBlockSizeInPCMFrames = local_230.unused._2_2_;
                      pInit->hasMetadataBlocks = (uint)((char)local_254 == '\0');
                      if (local_238 != (ma_dr_flac_meta_proc)0x0) {
                        local_200.type = 0;
                        local_200.pRawData = (void *)0x0;
                        local_200.rawDataSize = 0;
                        local_200.data.picture.width = local_210;
                        local_200.data.picture.height = mStack_20c;
                        local_200.data.picture.colorDepth = mStack_208;
                        local_200.data.picture.indexColorCount = mStack_204;
                        local_200.data.application.dataSize = local_220;
                        local_200.data._20_4_ = uStack_21c;
                        local_200.data.streaminfo.totalPCMFrameCount._0_4_ = uStack_218;
                        local_200.data.streaminfo.totalPCMFrameCount._4_4_ = uStack_214;
                        local_200.data.padding.unused =
                             (anon_struct_4_1_6f0ff714_for_padding)
                             (anon_struct_4_1_6f0ff714_for_padding)local_230.unused;
                        local_200.data.streaminfo.minFrameSizeInPCMFrames = mStack_22c;
                        local_200.data.streaminfo.maxFrameSizeInPCMFrames = mStack_228;
                        local_200.data.streaminfo.sampleRate = mStack_224;
                        (*local_238)(local_248,&local_200);
                      }
                      mVar1 = pInit->runningFilePos;
                      pInit->runningFilePos = mVar1 + 0x33;
                      pInit->oggFirstBytePos = mVar1 - 0x1c;
                      pInit->oggSerial = local_150.serialNumber;
                      memcpy(local_240,&local_150,0x120);
                      cVar8 = '\x02';
                    }
                  }
                }
                else {
                  mVar3 = (*onSeek)(pUserData,0x2e,ma_dr_flac_seek_origin_current);
                  cVar8 = mVar3 == 0;
                }
              }
              if (cVar8 == '\0') {
LAB_0016877b:
                cVar8 = '\0';
              }
            }
            else {
              mVar3 = (*onSeek)(pUserData,0x32,ma_dr_flac_seek_origin_current);
              if (mVar3 != 0) goto LAB_0016877b;
            }
          }
          if (cVar8 == '\0') {
LAB_00168783:
            pInit->runningFilePos = pInit->runningFilePos + (long)iVar6;
            mVar2 = ma_dr_flac_ogg__read_page_header
                              (onRead,pUserData,&local_150,&local_25c,&local_24c);
            if (mVar2 != MA_SUCCESS) goto LAB_001687ab;
            pInit->runningFilePos = pInit->runningFilePos + (ulong)local_25c;
            cVar8 = '\0';
          }
        }
        else {
          cVar8 = '\x01';
          mVar3 = (*onSeek)(pUserData,iVar6,ma_dr_flac_seek_origin_current);
          if (mVar3 != 0) goto LAB_00168783;
        }
      }
    } while (cVar8 == '\0');
    if (cVar8 == '\x02') {
      pInit->hasMetadataBlocks = 1;
      mVar3 = 1;
    }
    else {
      mVar3 = 0;
    }
  }
  return mVar3;
}

Assistant:

static ma_bool32 ma_dr_flac__init_private__ogg(ma_dr_flac_init_info* pInit, ma_dr_flac_read_proc onRead, ma_dr_flac_seek_proc onSeek, ma_dr_flac_meta_proc onMeta, void* pUserData, void* pUserDataMD, ma_bool32 relaxed)
{
    ma_dr_flac_ogg_page_header header;
    ma_uint32 crc32 = MA_DR_FLAC_OGG_CAPTURE_PATTERN_CRC32;
    ma_uint32 bytesRead = 0;
    (void)relaxed;
    pInit->container = ma_dr_flac_container_ogg;
    pInit->oggFirstBytePos = 0;
    if (ma_dr_flac_ogg__read_page_header_after_capture_pattern(onRead, pUserData, &header, &bytesRead, &crc32) != MA_SUCCESS) {
        return MA_FALSE;
    }
    pInit->runningFilePos += bytesRead;
    for (;;) {
        int pageBodySize;
        if ((header.headerType & 0x02) == 0) {
            return MA_FALSE;
        }
        pageBodySize = ma_dr_flac_ogg__get_page_body_size(&header);
        if (pageBodySize == 51) {
            ma_uint32 bytesRemainingInPage = pageBodySize;
            ma_uint8 packetType;
            if (onRead(pUserData, &packetType, 1) != 1) {
                return MA_FALSE;
            }
            bytesRemainingInPage -= 1;
            if (packetType == 0x7F) {
                ma_uint8 sig[4];
                if (onRead(pUserData, sig, 4) != 4) {
                    return MA_FALSE;
                }
                bytesRemainingInPage -= 4;
                if (sig[0] == 'F' && sig[1] == 'L' && sig[2] == 'A' && sig[3] == 'C') {
                    ma_uint8 mappingVersion[2];
                    if (onRead(pUserData, mappingVersion, 2) != 2) {
                        return MA_FALSE;
                    }
                    if (mappingVersion[0] != 1) {
                        return MA_FALSE;
                    }
                    if (!onSeek(pUserData, 2, ma_dr_flac_seek_origin_current)) {
                        return MA_FALSE;
                    }
                    if (onRead(pUserData, sig, 4) != 4) {
                        return MA_FALSE;
                    }
                    if (sig[0] == 'f' && sig[1] == 'L' && sig[2] == 'a' && sig[3] == 'C') {
                        ma_dr_flac_streaminfo streaminfo;
                        ma_uint8 isLastBlock;
                        ma_uint8 blockType;
                        ma_uint32 blockSize;
                        if (!ma_dr_flac__read_and_decode_block_header(onRead, pUserData, &isLastBlock, &blockType, &blockSize)) {
                            return MA_FALSE;
                        }
                        if (blockType != MA_DR_FLAC_METADATA_BLOCK_TYPE_STREAMINFO || blockSize != 34) {
                            return MA_FALSE;
                        }
                        if (ma_dr_flac__read_streaminfo(onRead, pUserData, &streaminfo)) {
                            pInit->hasStreamInfoBlock      = MA_TRUE;
                            pInit->sampleRate              = streaminfo.sampleRate;
                            pInit->channels                = streaminfo.channels;
                            pInit->bitsPerSample           = streaminfo.bitsPerSample;
                            pInit->totalPCMFrameCount      = streaminfo.totalPCMFrameCount;
                            pInit->maxBlockSizeInPCMFrames = streaminfo.maxBlockSizeInPCMFrames;
                            pInit->hasMetadataBlocks       = !isLastBlock;
                            if (onMeta) {
                                ma_dr_flac_metadata metadata;
                                metadata.type = MA_DR_FLAC_METADATA_BLOCK_TYPE_STREAMINFO;
                                metadata.pRawData = NULL;
                                metadata.rawDataSize = 0;
                                metadata.data.streaminfo = streaminfo;
                                onMeta(pUserDataMD, &metadata);
                            }
                            pInit->runningFilePos  += pageBodySize;
                            pInit->oggFirstBytePos  = pInit->runningFilePos - 79;
                            pInit->oggSerial        = header.serialNumber;
                            pInit->oggBosHeader     = header;
                            break;
                        } else {
                            return MA_FALSE;
                        }
                    } else {
                        return MA_FALSE;
                    }
                } else {
                    if (!onSeek(pUserData, bytesRemainingInPage, ma_dr_flac_seek_origin_current)) {
                        return MA_FALSE;
                    }
                }
            } else {
                if (!onSeek(pUserData, bytesRemainingInPage, ma_dr_flac_seek_origin_current)) {
                    return MA_FALSE;
                }
            }
        } else {
            if (!onSeek(pUserData, pageBodySize, ma_dr_flac_seek_origin_current)) {
                return MA_FALSE;
            }
        }
        pInit->runningFilePos += pageBodySize;
        if (ma_dr_flac_ogg__read_page_header(onRead, pUserData, &header, &bytesRead, &crc32) != MA_SUCCESS) {
            return MA_FALSE;
        }
        pInit->runningFilePos += bytesRead;
    }
    pInit->hasMetadataBlocks = MA_TRUE;
    return MA_TRUE;
}